

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void enet_host_compress(ENetHost *host,ENetCompressor *compressor)

{
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var3;
  
  pvVar1 = (host->compressor).context;
  if ((pvVar1 != (void *)0x0) &&
     (p_Var2 = (host->compressor).destroy, p_Var2 != (_func_void_void_ptr *)0x0)) {
    (*p_Var2)(pvVar1);
  }
  if (compressor == (ENetCompressor *)0x0) {
    (host->compressor).context = (void *)0x0;
  }
  else {
    pvVar1 = compressor->context;
    p_Var3 = compressor->compress;
    p_Var2 = compressor->destroy;
    (host->compressor).decompress = compressor->decompress;
    (host->compressor).destroy = p_Var2;
    (host->compressor).context = pvVar1;
    (host->compressor).compress = p_Var3;
  }
  return;
}

Assistant:

void
enet_host_compress (ENetHost * host, const ENetCompressor * compressor)
{
    if (host -> compressor.context != NULL && host -> compressor.destroy)
      (* host -> compressor.destroy) (host -> compressor.context);

    if (compressor)
      host -> compressor = * compressor;
    else
      host -> compressor.context = NULL;
}